

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_bit.c
# Opt level: O2

int lj_ffh_bit_bswap(lua_State *L)

{
  uint in_EAX;
  int iVar1;
  uint64_t uVar2;
  ulong uStack_18;
  CTypeID id;
  
  uStack_18 = (ulong)in_EAX;
  uVar2 = lj_carith_check64(L,1,&id);
  if (id == 0) {
    iVar1 = 0;
  }
  else {
    bit_result64(L,id,uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                      (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                      (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
                      (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38);
    iVar1 = 2;
  }
  return iVar1;
}

Assistant:

LJLIB_ASM(bit_bswap)		LJLIB_REC(bit_unary IR_BSWAP)
{
#if LJ_HASFFI
  CTypeID id = 0;
  uint64_t x = lj_carith_check64(L, 1, &id);
  return id ? bit_result64(L, id, lj_bswap64(x)) : FFH_RETRY;
#else
  lj_lib_checknumber(L, 1);
  return FFH_RETRY;
#endif
}